

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O1

int uv__fs_statx(int fd,char *path,int is_fstat,int is_lstat,uv_stat_t *buf)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  ulonglong uVar5;
  uv__statx statxbuf;
  uv__statx uStack_108;
  
  iVar3 = -0x26;
  if (uv__fs_statx_no_statx == '\0') {
    if (is_fstat == 0) {
      fd = -100;
    }
    iVar2 = (uint)(is_fstat != 0) * 0x1000;
    iVar3 = iVar2 + 0x100;
    if (is_lstat == 0) {
      iVar3 = iVar2;
    }
    iVar3 = uv__statx(fd,path,iVar3,0xfff,&uStack_108);
    if (iVar3 == 0) {
      uVar5 = gnu_dev_makedev(uStack_108.stx_dev_major,uStack_108.stx_dev_minor);
      buf->st_dev = uVar5;
      buf->st_mode = (ulong)uStack_108.stx_mode;
      buf->st_nlink = (ulong)uStack_108.stx_nlink;
      buf->st_uid = (ulong)uStack_108.stx_uid;
      buf->st_gid = (ulong)uStack_108.stx_gid;
      uVar5 = gnu_dev_makedev(uStack_108.stx_rdev_major,uStack_108.stx_rdev_minor);
      buf->st_rdev = uVar5;
      buf->st_ino = uStack_108.stx_ino;
      buf->st_size = uStack_108.stx_size;
      buf->st_blksize = (ulong)uStack_108.stx_blksize;
      buf->st_blocks = uStack_108.stx_blocks;
      (buf->st_atim).tv_sec = uStack_108.stx_atime.tv_sec;
      (buf->st_atim).tv_nsec = (ulong)uStack_108.stx_atime.tv_nsec;
      (buf->st_mtim).tv_sec = uStack_108.stx_mtime.tv_sec;
      (buf->st_mtim).tv_nsec = (ulong)uStack_108.stx_mtime.tv_nsec;
      (buf->st_ctim).tv_sec = uStack_108.stx_ctime.tv_sec;
      (buf->st_ctim).tv_nsec = (ulong)uStack_108.stx_ctime.tv_nsec;
      (buf->st_birthtim).tv_sec = uStack_108.stx_btime.tv_sec;
      (buf->st_birthtim).tv_nsec = (ulong)uStack_108.stx_btime.tv_nsec;
      buf->st_flags = 0;
      buf->st_gen = 0;
      iVar3 = 0;
    }
    else {
      if (iVar3 == -1) {
        puVar4 = (uint *)__errno_location();
        uVar1 = *puVar4;
        if (((0x26 < (ulong)uVar1) || ((0x4000400002U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
           (uVar1 != 0x5f)) {
          return -1;
        }
      }
      uv__fs_statx_no_statx = '\x01';
      iVar3 = -0x26;
    }
  }
  return iVar3;
}

Assistant:

static int uv__fs_statx(int fd,
                        const char* path,
                        int is_fstat,
                        int is_lstat,
                        uv_stat_t* buf) {
  STATIC_ASSERT(UV_ENOSYS != -1);
#ifdef __linux__
  static int no_statx;
  struct uv__statx statxbuf;
  int dirfd;
  int flags;
  int mode;
  int rc;

  if (uv__load_relaxed(&no_statx))
    return UV_ENOSYS;

  dirfd = AT_FDCWD;
  flags = 0; /* AT_STATX_SYNC_AS_STAT */
  mode = 0xFFF; /* STATX_BASIC_STATS + STATX_BTIME */

  if (is_fstat) {
    dirfd = fd;
    flags |= 0x1000; /* AT_EMPTY_PATH */
  }

  if (is_lstat)
    flags |= AT_SYMLINK_NOFOLLOW;

  rc = uv__statx(dirfd, path, flags, mode, &statxbuf);

  switch (rc) {
  case 0:
    break;
  case -1:
    /* EPERM happens when a seccomp filter rejects the system call.
     * Has been observed with libseccomp < 2.3.3 and docker < 18.04.
     * EOPNOTSUPP is used on DVS exported filesystems
     */
    if (errno != EINVAL && errno != EPERM && errno != ENOSYS && errno != EOPNOTSUPP)
      return -1;
    /* Fall through. */
  default:
    /* Normally on success, zero is returned and On error, -1 is returned.
     * Observed on S390 RHEL running in a docker container with statx not
     * implemented, rc might return 1 with 0 set as the error code in which
     * case we return ENOSYS.
     */
    uv__store_relaxed(&no_statx, 1);
    return UV_ENOSYS;
  }

  buf->st_dev = makedev(statxbuf.stx_dev_major, statxbuf.stx_dev_minor);
  buf->st_mode = statxbuf.stx_mode;
  buf->st_nlink = statxbuf.stx_nlink;
  buf->st_uid = statxbuf.stx_uid;
  buf->st_gid = statxbuf.stx_gid;
  buf->st_rdev = makedev(statxbuf.stx_rdev_major, statxbuf.stx_rdev_minor);
  buf->st_ino = statxbuf.stx_ino;
  buf->st_size = statxbuf.stx_size;
  buf->st_blksize = statxbuf.stx_blksize;
  buf->st_blocks = statxbuf.stx_blocks;
  buf->st_atim.tv_sec = statxbuf.stx_atime.tv_sec;
  buf->st_atim.tv_nsec = statxbuf.stx_atime.tv_nsec;
  buf->st_mtim.tv_sec = statxbuf.stx_mtime.tv_sec;
  buf->st_mtim.tv_nsec = statxbuf.stx_mtime.tv_nsec;
  buf->st_ctim.tv_sec = statxbuf.stx_ctime.tv_sec;
  buf->st_ctim.tv_nsec = statxbuf.stx_ctime.tv_nsec;
  buf->st_birthtim.tv_sec = statxbuf.stx_btime.tv_sec;
  buf->st_birthtim.tv_nsec = statxbuf.stx_btime.tv_nsec;
  buf->st_flags = 0;
  buf->st_gen = 0;

  return 0;
#else
  return UV_ENOSYS;
#endif /* __linux__ */
}